

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

Cluster * __thiscall mkvparser::Segment::GetLast(Segment *this)

{
  if ((this->m_clusters != (Cluster **)0x0) && (0 < this->m_clusterCount)) {
    return this->m_clusters[this->m_clusterCount + -1];
  }
  return &this->m_eos;
}

Assistant:

const Cluster* Segment::GetLast() const {
  if ((m_clusters == NULL) || (m_clusterCount <= 0))
    return &m_eos;

  const long idx = m_clusterCount - 1;

  Cluster* const pCluster = m_clusters[idx];
  assert(pCluster);

  return pCluster;
}